

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# template_cache.cc
# Opt level: O0

void __thiscall
ctemplate::TemplateCache::RefcountedTemplate::DecRefN(RefcountedTemplate *this,int n)

{
  MutexLock local_20;
  MutexLock ml;
  bool refcount_is_zero;
  int n_local;
  RefcountedTemplate *this_local;
  
  ml.mu_._4_4_ = n;
  MutexLock::MutexLock(&local_20,&this->mutex_);
  if (this->refcount_ < ml.mu_._4_4_) {
    __assert_fail("refcount_ >= n",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rockdreamer[P]ctemplate/src/template_cache.cc"
                  ,0x66,"void ctemplate::TemplateCache::RefcountedTemplate::DecRefN(int)");
  }
  this->refcount_ = this->refcount_ - ml.mu_._4_4_;
  ml.mu_._3_1_ = this->refcount_ == 0;
  MutexLock::~MutexLock(&local_20);
  if (((ml.mu_._3_1_ & 1) != 0) && (this != (RefcountedTemplate *)0x0)) {
    ~RefcountedTemplate(this);
    operator_delete(this);
  }
  return;
}

Assistant:

void DecRefN(int n) {
    bool refcount_is_zero;
    {
      MutexLock ml(&mutex_);
      assert(refcount_ >= n);
      refcount_ -= n;
      refcount_is_zero = (refcount_ == 0);
    }
    // We can't delete this within the MutexLock, because when the
    // MutexLock tries to unlock Mutex at function-exit, the mutex
    // will have been deleted!  This is just as safe as doing the
    // delete within the lock -- in either case, if anyone tried to do
    // anything to this class after the refcount got to 0, bad things
    // would happen.
    if (refcount_is_zero)
      delete this;
  }